

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixMapfile(unixFile *pFd,i64 nMap)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  void *pvVar5;
  uint *puVar6;
  char *pcVar7;
  long lVar8;
  i64 nReuse;
  char *pcVar9;
  stat statbuf;
  undefined1 local_c0 [48];
  long local_90;
  
  if (0 < pFd->nFetchOut) {
    return 0;
  }
  if ((nMap < 0) &&
     (iVar4 = (*aSyscall[5].pCurrent)((ulong)(uint)pFd->h,local_c0), nMap = local_90, iVar4 != 0)) {
    return 0x70a;
  }
  lVar2 = pFd->mmapSize;
  lVar8 = pFd->mmapSizeMax;
  if (nMap < pFd->mmapSizeMax) {
    lVar8 = nMap;
  }
  if (lVar8 == lVar2) {
    return 0;
  }
  uVar1 = pFd->h;
  pvVar3 = pFd->pMapRegion;
  if (pvVar3 == (void *)0x0) {
    pcVar9 = "mmap";
  }
  else {
    if (pFd->mmapSizeActual != lVar2) {
      (*aSyscall[0x17].pCurrent)(lVar2 + (long)pvVar3);
    }
    pvVar5 = (void *)(*aSyscall[0x18].pCurrent)(pvVar3,lVar2,lVar8,1);
    if (1 < (long)pvVar5 + 1U) {
      pcVar9 = "mremap";
      goto LAB_00146c2b;
    }
    (*aSyscall[0x17].pCurrent)(pvVar3,lVar2);
    pcVar9 = "mremap";
    if (pvVar5 != (void *)0x0) goto LAB_00146c2b;
  }
  pvVar5 = (void *)(*aSyscall[0x16].pCurrent)(0,lVar8,1,1,(ulong)uVar1,0);
LAB_00146c2b:
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pcVar7 = pFd->zPath;
    puVar6 = (uint *)__errno_location();
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    pvVar5 = (void *)0x0;
    sqlite3_log(0,"os_unix.c:%d: (%d) %s(%s) - %s",0xa386,(ulong)*puVar6,pcVar9,pcVar7,"");
    pFd->mmapSizeMax = 0;
    lVar8 = 0;
  }
  pFd->pMapRegion = pvVar5;
  pFd->mmapSizeActual = lVar8;
  pFd->mmapSize = lVar8;
  return 0;
}

Assistant:

static int unixMapfile(unixFile *pFd, i64 nMap){
  assert( nMap>=0 || pFd->nFetchOut==0 );
  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( pFd->nFetchOut>0 ) return SQLITE_OK;

  if( nMap<0 ){
    struct stat statbuf;          /* Low-level file information */
    if( osFstat(pFd->h, &statbuf) ){
      return SQLITE_IOERR_FSTAT;
    }
    nMap = statbuf.st_size;
  }
  if( nMap>pFd->mmapSizeMax ){
    nMap = pFd->mmapSizeMax;
  }

  assert( nMap>0 || (pFd->mmapSize==0 && pFd->pMapRegion==0) );
  if( nMap!=pFd->mmapSize ){
    unixRemapfile(pFd, nMap);
  }

  return SQLITE_OK;
}